

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void GameLoop::startTournament(void)

{
  Map *map;
  pointer ppMVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  pointer ppMVar9;
  vector<Player_*,_std::allocator<Player_*>_> *playerList;
  Deck *this;
  GameLoop *pGVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  ulong uVar14;
  int i;
  int iVar15;
  size_type sVar16;
  int iVar17;
  char *pcVar18;
  string *psVar19;
  long lVar20;
  ulong uVar21;
  int local_1a4;
  allocator<char> local_191;
  string mapToLoad;
  Map *gameMap;
  pointer pbStack_160;
  pointer local_158;
  pointer local_150;
  vector<char,_std::allocator<char>_> playerStrats;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mapNames;
  _Vector_base<char,_std::allocator<char>_> local_100;
  MapLoader myLoader;
  vector<int,_std::allocator<int>_> winners;
  vector<Map_*,_std::allocator<Map_*>_> mapList;
  _Vector_base<int,_std::allocator<int>_> local_80;
  _Vector_base<char,_std::allocator<char>_> local_68;
  string local_50;
  
  iVar17 = 0x12c0ac;
  std::operator<<((ostream *)&std::cout,
                  "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n \\   \\/    \\/   /  |  |__   |  |     |  ,----\'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  \'  /  |  | \n  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n   \\    /\\    /    |  |____ |  `----.|  `----.|  `--\'  | |  |  |  | |  |____        |  |     |  `--\'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n                                                                                                                                                        "
                 );
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  iVar4 = choosePlayerNumber(4,iVar17);
  playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar17 = 1;
  do {
    while( true ) {
      do {
        poVar6 = std::operator<<((ostream *)&std::cout,"What strategy should player ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar17);
        poVar6 = std::operator<<(poVar6," use? a) aggresive b) passive c) random d) cheater");
        std::endl<char,std::char_traits<char>>(poVar6);
        std::operator>>((istream *)&std::cin,(char *)&mapToLoad);
        std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13d520);
        std::istream::ignore((long)&std::cin,0x200);
      } while ((byte)((char)mapToLoad._M_dataplus._M_p + 0x9bU) < 0xfc);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,&mapToLoad);
      if (_Var7._M_current ==
          playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "Please choose a different strategy, this one is already taken by another player"
                              );
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::vector<char,_std::allocator<char>_>::push_back(&playerStrats,(value_type *)&mapToLoad);
    bVar2 = iVar17 < iVar4;
    iVar17 = iVar17 + 1;
  } while (bVar2);
  mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mapNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mapNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mapNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar17 = 0;
  do {
    mapToLoad._M_dataplus._M_p = (pointer)&mapToLoad.field_2;
    mapToLoad._M_string_length = 0;
    mapToLoad.field_2._M_local_buf[0] = '\0';
    if (iVar17 == 0) {
LAB_0010ee87:
      chooseMap_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&mapToLoad,(string *)&myLoader);
      std::__cxx11::string::~string((string *)&myLoader);
      std::__cxx11::string::string((string *)&local_50,(string *)&mapToLoad);
      MapLoader::MapLoader(&myLoader,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      gameMap = MapLoader::readMapFile(&myLoader);
      if (gameMap == (Map *)0x0) {
        AlternativeLoader::AlternativeLoader((AlternativeLoader *)&winners,&mapToLoad);
        gameMap = AlternativeLoader::altReadMapFile((AlternativeLoader *)&winners);
        AlternativeLoader::~AlternativeLoader((AlternativeLoader *)&winners);
        pcVar18 = "\nThere was an error loading the game board. Try another mapfile.\n";
        if (gameMap != (Map *)0x0) goto LAB_0010ef1e;
LAB_0010efd9:
        std::operator<<((ostream *)&std::cout,pcVar18);
LAB_0010efe1:
        bVar2 = false;
        iVar15 = iVar17;
      }
      else {
LAB_0010ef1e:
        bVar2 = Map::testConnected(gameMap);
        pcVar18 = "\nThere was an error loading the game board. Try another mapfile.\n";
        if (!bVar2) goto LAB_0010efd9;
        if ((int)((ulong)((long)(gameMap->pMapCountries->
                                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(gameMap->pMapCountries->
                               super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3) < iVar4) {
          poVar6 = std::operator<<((ostream *)&std::cout,"The selected map with ");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6," cannot support ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          poVar6 = std::operator<<(poVar6," players. Please try again.");
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_0010efe1;
        }
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (mapNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           mapNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&mapToLoad);
        pcVar18 = "\nThis map was already chosen, choose another map file.\n";
        if (_Var8._M_current !=
            mapNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010efd9;
        std::vector<Map_*,_std::allocator<Map_*>_>::push_back(&mapList,&gameMap);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&mapNames,&mapToLoad);
        iVar15 = iVar17 + 1;
        if (iVar17 < 4) {
          bVar2 = false;
        }
        else {
          bVar2 = true;
          std::operator<<((ostream *)&std::cout,"\nThe maximum number of maps was created.\n");
        }
      }
      MapLoader::~MapLoader(&myLoader);
      iVar17 = iVar15;
    }
    else {
      myLoader._vptr_MapLoader._0_1_ = 'z';
      do {
        std::operator<<((ostream *)&std::cout,
                        "\nWould you like to add a map to the tournament (y / n) ? ");
        std::operator>>((istream *)&std::cin,(char *)&myLoader);
        std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13d520);
        std::istream::ignore((long)&std::cin,0x200);
        if ((char)myLoader._vptr_MapLoader == 'y') break;
      } while ((char)myLoader._vptr_MapLoader != 'n');
      bVar2 = true;
      if ((char)myLoader._vptr_MapLoader == 'y') goto LAB_0010ee87;
    }
    std::__cxx11::string::~string((string *)&mapToLoad);
  } while (!bVar2);
  do {
    std::operator<<((ostream *)&std::cout,
                    "please choose the number of games to be played on each map (between 1 and 5) : \n"
                   );
    std::istream::operator>>((istream *)&std::cin,(int *)&mapToLoad);
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13d520);
    std::istream::ignore((long)&std::cin,0x200);
    iVar17 = (int)mapToLoad._M_dataplus._M_p;
    uVar14 = (ulong)mapToLoad._M_dataplus._M_p & 0xffffffff;
  } while ((int)mapToLoad._M_dataplus._M_p - 6U < 0xfffffffb);
  do {
    std::operator<<((ostream *)&std::cout,
                    "please choose the maximum number of turns to be played on each map (between 3 and 50) : \n"
                   );
    std::istream::operator>>((istream *)&std::cin,(int *)&mapToLoad);
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13d520);
    std::istream::ignore((long)&std::cin,0x200);
    ppMVar1 = mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar15 = (int)mapToLoad._M_dataplus._M_p;
  } while ((int)mapToLoad._M_dataplus._M_p - 0x33U < 0xffffffd0);
  winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ppMVar9 = mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppMVar9 != ppMVar1) {
    map = *ppMVar9;
    uVar21 = uVar14;
    local_150 = ppMVar9;
    while (iVar5 = (int)uVar21, uVar21 = (ulong)(iVar5 - 1), iVar5 != 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_68,&playerStrats);
      playerList = initPlayers(iVar4,map,(vector<char,_std::allocator<char>_> *)&local_68);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
      this = (Deck *)operator_new(0x18);
      Deck::Deck(this,(int)((ulong)((long)(map->pMapCountries->
                                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(map->pMapCountries->
                                         super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3));
      Deck::createDeck(this);
      initInstance(map,playerList,this);
      pGVar10 = getInstance();
      distributeArmies(pGVar10);
      pGVar10 = getInstance();
      iVar5 = loop(pGVar10,iVar15);
      mapToLoad._M_dataplus._M_p._0_4_ = iVar5;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&winners,(int *)&mapToLoad);
      resetInstance();
    }
    ppMVar9 = local_150 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_130,&mapNames);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_100,&playerStrats);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_80,&winners);
  std::operator<<((ostream *)&std::cout,
                  "\n\n--------------------------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"--------------------Game Statistics---------------------\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "--------------------------------------------------------\n\n");
  std::operator<<((ostream *)&std::cout,"M: ");
  for (sVar16 = 0;
      iVar4 = (int)((ulong)((long)local_130.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_130.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5),
      (long)sVar16 < (long)iVar4; sVar16 = sVar16 + 1) {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&local_130,sVar16);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)pvVar11);
    if (sVar16 == iVar4 - 1) {
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      std::operator<<(poVar6,", ");
    }
  }
  gameMap = (Map *)0x0;
  pbStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  std::operator<<((ostream *)&std::cout,"P: ");
  sVar16 = 0;
  do {
    if ((long)((int)local_100._M_impl.super__Vector_impl_data._M_finish -
              (int)local_100._M_impl.super__Vector_impl_data._M_start) <= (long)sVar16) {
      poVar6 = std::operator<<((ostream *)&std::cout,"G: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar17);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"D: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar15);
      std::endl<char,std::char_traits<char>>(poVar6);
      local_1a4 = 0;
      iVar4 = 0;
      for (lVar20 = 0;
          lVar20 < ((long)local_130.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_130.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 0x8000000 + 0x100000000 >>
                   0x20; lVar20 = lVar20 + 1) {
        local_150 = (pointer)(lVar20 + -1);
        for (iVar15 = 0; iVar17 + 1 != iVar15; iVar15 = iVar15 + 1) {
          if (iVar15 == 0 && (int)lVar20 == 0) {
            poVar6 = std::operator<<((ostream *)&std::cout,"\n\n");
            std::__cxx11::string::string<std::allocator<char>>((string *)&myLoader," ",&local_191);
            centerOut(&mapToLoad,(string *)&myLoader,0x14);
            poVar6 = std::operator<<(poVar6,(string *)&mapToLoad);
            std::operator<<(poVar6," | ");
            std::__cxx11::string::~string((string *)&mapToLoad);
            psVar19 = (string *)&myLoader;
          }
          else {
            psVar19 = &mapToLoad;
            if (lVar20 == 0) {
              std::__cxx11::to_string((string *)&myLoader,iVar15);
              std::operator+(&mapToLoad,"Game ",(string *)&myLoader);
              std::__cxx11::string::~string((string *)&myLoader);
              centerOut((string *)&myLoader,&mapToLoad,10);
              poVar6 = std::operator<<((ostream *)&std::cout,(string *)&myLoader);
              std::operator<<(poVar6," | ");
              std::__cxx11::string::~string((string *)&myLoader);
              iVar4 = iVar4 + 1;
            }
            else if (iVar15 == 0) {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::at(&local_130,(size_type)local_150);
              centerOut(&mapToLoad,pvVar11,0x14);
              poVar6 = std::operator<<((ostream *)&std::cout,(string *)&mapToLoad);
              std::operator<<(poVar6," | ");
            }
            else {
              mapToLoad._M_dataplus._M_p = (pointer)&mapToLoad.field_2;
              mapToLoad._M_string_length = 0;
              mapToLoad.field_2._M_local_buf[0] = '\0';
              pvVar13 = std::vector<int,_std::allocator<int>_>::at
                                  ((vector<int,_std::allocator<int>_> *)&local_80,(long)local_1a4);
              if ((long)*pvVar13 == 0xffffffffffffffff) {
                std::__cxx11::string::assign((char *)&mapToLoad);
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gameMap,(long)*pvVar13);
                std::__cxx11::string::_M_assign((string *)&mapToLoad);
              }
              centerOut((string *)&myLoader,&mapToLoad,10);
              poVar6 = std::operator<<((ostream *)&std::cout,(string *)&myLoader);
              std::operator<<(poVar6," | ");
              local_1a4 = local_1a4 + 1;
              std::__cxx11::string::~string((string *)&myLoader);
            }
          }
          std::__cxx11::string::~string((string *)psVar19);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        iVar15 = iVar4 * 0xd;
        if (iVar15 < -0x15) {
          iVar15 = -0x16;
        }
        iVar15 = iVar15 + 0x16;
        while (bVar2 = iVar15 != 0, iVar15 = iVar15 + -1, bVar2) {
          std::operator<<((ostream *)&std::cout,"-");
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gameMap);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_80);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_130);
      std::operator<<((ostream *)&std::cout,
                      "\n.___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  \'  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--\'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n                                                                                                                                                                                     "
                     );
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&winners.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&mapNames);
      std::_Vector_base<Map_*,_std::allocator<Map_*>_>::~_Vector_base
                (&mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&playerStrats.super__Vector_base<char,_std::allocator<char>_>);
      return;
    }
    pvVar12 = std::vector<char,_std::allocator<char>_>::at
                        ((vector<char,_std::allocator<char>_> *)&local_100,sVar16);
    std::__cxx11::to_string(&mapToLoad,(int)*pvVar12);
    std::__cxx11::to_string((string *)&myLoader,0x61);
    _Var3 = std::operator==(&mapToLoad,(string *)&myLoader);
    std::__cxx11::string::~string((string *)&myLoader);
    if (_Var3) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gameMap,
                 (char (*) [10])"Aggresive");
    }
    else {
      std::__cxx11::to_string((string *)&myLoader,0x62);
      _Var3 = std::operator==(&mapToLoad,(string *)&myLoader);
      std::__cxx11::string::~string((string *)&myLoader);
      pcVar18 = "Passive";
      if (!_Var3) {
        std::__cxx11::to_string((string *)&myLoader,99);
        _Var3 = std::operator==(&mapToLoad,(string *)&myLoader);
        std::__cxx11::string::~string((string *)&myLoader);
        if (_Var3) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[7]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gameMap,
                     (char (*) [7])"Random");
          goto LAB_0010f457;
        }
        std::__cxx11::to_string((string *)&myLoader,100);
        _Var3 = std::operator==(&mapToLoad,(string *)&myLoader);
        std::__cxx11::string::~string((string *)&myLoader);
        pcVar18 = "Unknown";
        if (_Var3) {
          pcVar18 = "Cheater";
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[8]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gameMap,
                 (char (*) [8])pcVar18);
    }
LAB_0010f457:
    if (sVar16 == (uint)(((int)local_100._M_impl.super__Vector_impl_data._M_finish + -1) -
                        (int)local_100._M_impl.super__Vector_impl_data._M_start)) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gameMap,sVar16);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)pvVar11);
      poVar6 = std::operator<<(poVar6,".");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gameMap,sVar16);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)pvVar11);
      std::operator<<(poVar6,", ");
    }
    std::__cxx11::string::~string((string *)&mapToLoad);
    sVar16 = sVar16 + 1;
  } while( true );
}

Assistant:

void GameLoop::startTournament() {

    std::cout
            << "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n"
               "\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n"
               " \\   \\/    \\/   /  |  |__   |  |     |  ,----'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  '  /  |  | \n"
               "  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n"
               "   \\    /\\    /    |  |____ |  `----.|  `----.|  `--'  | |  |  |  | |  |____        |  |     |  `--'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n"
               "    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n"
               "                                                                                                                                                        ";
    std::cout << endl;
    int numberOfPlayers = choosePlayerNumber(2, 4);
    vector<char> playerStrats = choosePlayerStrats(numberOfPlayers);
    int numMaps = 0;
    vector<Map*> mapList;
    vector<string> mapNames;
    do {
        //which map to load
        std::string mapToLoad;
        Map* gameMap;
        if (numMaps == 0 || loadOtherMap()) {
            mapToLoad = chooseMap();
        } else {
            break;
        }
        //load the map (try to use both loaders, to accept both map types)
        MapLoader myLoader = MapLoader(mapToLoad);
        gameMap = myLoader.readMapFile();
        if (gameMap == nullptr) {
            AlternativeLoader altLoader = AlternativeLoader(mapToLoad);
            gameMap = altLoader.altReadMapFile();
        }
        //test map
        if (gameMap == nullptr || !gameMap->testConnected()) {
            cout << "\nThere was an error loading the game board. Try another mapfile.\n";
            continue;
        } else if (int(gameMap->getMapCountries()->size()) < numberOfPlayers) {
            std::cout << "The selected map with " << gameMap->getMapCountries()->size() << " cannot support "
                      << numberOfPlayers << " players. Please try again." << std::endl;
            continue;
        } else if (std::find(mapNames.begin(), mapNames.end(), mapToLoad) != mapNames.end()) {
            cout << "\nThis map was already chosen, choose another map file.\n";
            continue;
        } else {
            numMaps++;
            mapList.push_back(gameMap);
            mapNames.push_back(mapToLoad);
        }
        //bail
        if (numMaps >= 5) {
            cout << "\nThe maximum number of maps was created.\n";
            break;
        }
    } while (true);

    //fetch game settings
    int numGamesToPlay = chooseNumGamesToPlay();
    int maxTurns = chooseMaxTurns();

    //run the games
    vector<int> winners;
    for (auto currentMap : mapList) {
        for (int i = 0; i < numGamesToPlay; i++) {
            std::vector<Player*>* gamePlayers = initPlayers(numberOfPlayers, currentMap, playerStrats);
            Deck* gameDeck = new Deck(currentMap->getMapCountries()->size());
            gameDeck->createDeck();
            GameLoop::initInstance(currentMap, gamePlayers, gameDeck);

            GameLoop::getInstance()->distributeArmies();
            winners.push_back(GameLoop::getInstance()->loop(maxTurns));
            GameLoop::resetInstance();
        }
    }
    printGameReport(mapNames, playerStrats, numGamesToPlay, maxTurns, winners);
    std::cout << "\n"
                 ".___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n"
                 "|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n"
                 "`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  '  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n"
                 "    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n"
                 "    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n"
                 "    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n"
                 "                                                                                                                                                                                     ";
}